

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  FunctionTask *in_stack_00000008;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  uint32_t in_stack_fffffffffffffe98;
  uint32_t in_stack_fffffffffffffe9c;
  uint32_t in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea4;
  Image *in_stack_fffffffffffffea8;
  FunctionTask *in_stack_fffffffffffffeb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffec8;
  
  FunctionTask::FunctionTask
            ((FunctionTask *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  FunctionTask::ProjectionProfile
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
             (bool)in_stack_fffffffffffffe97,in_stack_fffffffffffffec8);
  FunctionTask::~FunctionTask(in_stack_00000008);
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection )
    {
        FunctionTask().ProjectionProfile( image, x, y, width, height, horizontal, projection );
    }